

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall embree::ISPCTriangleMesh::~ISPCTriangleMesh(ISPCTriangleMesh *this)

{
  size_t i;
  ulong uVar1;
  
  if (this->positions != (Vec3fa **)0x0) {
    for (uVar1 = 0; uVar1 < this->numTimeSteps; uVar1 = uVar1 + 1) {
      alignedUSMFree(this->positions[uVar1]);
    }
    alignedUSMFree(this->positions);
  }
  if (this->normals != (Vec3fa **)0x0) {
    for (uVar1 = 0; uVar1 < this->numTimeSteps; uVar1 = uVar1 + 1) {
      alignedUSMFree(this->normals[uVar1]);
    }
    alignedUSMFree(this->normals);
  }
  alignedUSMFree(this->texcoords);
  alignedUSMFree(this->triangles);
  ISPCGeometry::~ISPCGeometry(&this->geom);
  return;
}

Assistant:

ISPCTriangleMesh::~ISPCTriangleMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }
    
    if (normals) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(normals[i]);
      alignedUSMFree(normals);
    }

    alignedUSMFree(texcoords);
    alignedUSMFree(triangles);
  }